

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O0

void __thiscall ncnn::Yolov3DetectionOutput::~Yolov3DetectionOutput(Yolov3DetectionOutput *this)

{
  Layer *in_RDI;
  
  in_RDI->_vptr_Layer = (_func_int **)&PTR__Yolov3DetectionOutput_00236300;
  ncnn::Mat::~Mat((Mat *)0x1fe8dd);
  ncnn::Mat::~Mat((Mat *)0x1fe8ee);
  ncnn::Mat::~Mat((Mat *)0x1fe8ff);
  Layer::~Layer(in_RDI);
  return;
}

Assistant:

Yolov3DetectionOutput::~Yolov3DetectionOutput()
{
    //delete softmax;
}